

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cc
# Opt level: O1

bool ssl::initialize(void)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  char *__s;
  size_t sVar8;
  long *plVar9;
  pointer __rhs;
  pointer __lhs;
  long lVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  undefined1 local_f0 [32];
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if ((initialize()::dirs_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&initialize()::dirs_abi_cxx11_), iVar7 != 0)) {
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/usr/lib/","");
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,".//usr/local/lib/","");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/usr/local/openssl/lib/","")
    ;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/usr/local/ssl/lib/","");
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/opt/openssl/lib/","");
    plVar9 = local_40;
    local_50[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/lib/","");
    __l._M_len = 6;
    __l._M_array = (iterator)local_f0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&initialize()::dirs_abi_cxx11_,__l,(allocator_type *)&local_110);
    lVar10 = -0xc0;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&initialize()::dirs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&initialize()::dirs_abi_cxx11_);
  }
  __s = getenv("SPONSORYEET_SSL_LIB");
  if (__s == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar8);
    bVar3 = attemptOpen(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = true;
  if (bVar3 == false) {
    if ((initialize()::libs_abi_cxx11_ == '\0') &&
       (iVar7 = __cxa_guard_acquire(&initialize()::libs_abi_cxx11_), iVar7 != 0)) {
      local_f0._0_8_ = local_f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"libssl.so","");
      plVar9 = local_c0;
      local_d0[0] = plVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"libgnutls-openssl.so","");
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&initialize()::libs_abi_cxx11_,__l_00,(allocator_type *)&local_130);
      lVar10 = -0x40;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&initialize()::libs_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&initialize()::libs_abi_cxx11_);
    }
    pbVar1 = initialize()::dirs_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (initialize()::dirs_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        initialize()::dirs_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __lhs = initialize()::dirs_abi_cxx11_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        pbVar2 = initialize()::libs_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __rhs = initialize()::libs_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        if (initialize()::libs_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            initialize()::libs_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::operator+(&local_130,__lhs,__rhs);
            std::filesystem::__cxx11::path::path((path *)local_f0,&local_130,auto_format);
            cVar5 = std::filesystem::status((path *)local_f0);
            std::filesystem::__cxx11::path::~path((path *)local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            bVar6 = 5;
            if ((cVar5 != '\0') && (cVar5 != -1)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,__lhs,__rhs);
              bVar6 = attemptOpen((string *)local_f0);
              if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
                operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
              }
            }
            if ((bVar6 != 5) && (bVar6 != 0)) goto LAB_0011c96c;
            __rhs = __rhs + 1;
          } while (__rhs != pbVar2);
          bVar6 = 0;
LAB_0011c96c:
          if ((bVar6 & 3) != 0) {
            return true;
          }
        }
        __lhs = __lhs + 1;
      } while (__lhs != pbVar1);
    }
    initialize();
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool initialize()
{
    static const std::vector<std::string> dirs = {
        "/usr/lib/",
        "./"
        "/usr/local/lib/",
        "/usr/local/openssl/lib/",
        "/usr/local/ssl/lib/",
        "/opt/openssl/lib/",
        "/lib/",
    };
    const char *manualPath = getenv("SPONSORYEET_SSL_LIB");
    if (manualPath && attemptOpen(manualPath)) {
        return true;
    }

    // TODO: more?
    static const std::vector<std::string> libs = {
        "libssl.so",
        "libgnutls-openssl.so"
    };
    for (const std::string &dir : dirs) {
        for (const std::string &filename : libs) {
            if (!std::filesystem::exists(dir + filename)) {
                continue;
            }
            if (attemptOpen(dir + filename)) {
                return true;
            }
        }
    }

    fprintf(stderr, "Failed to find any valid openssl (last error: %s\n)\n", dlerror());
    return false;
}